

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# millerrabin.c
# Opt level: O1

mp_int * miller_rabin_find_potential_primitive_root(MillerRabin *mr)

{
  bool bVar1;
  bool bVar2;
  mp_int *pmVar3;
  mr_result mVar4;
  mp_int *unaff_R15;
  
  do {
    pmVar3 = mp_random_in_range_fn(mr->two,mr->pm1,random_read);
    pmVar3 = mp_unsafe_shrink(pmVar3);
    mVar4 = miller_rabin_test_inner(mr,pmVar3);
    bVar2 = ((ulong)mVar4 & 0xffffffff) == 0;
    bVar1 = !bVar2;
    if ((ulong)mVar4 >> 0x20 == 0 || bVar2) {
      mp_free(pmVar3);
      if (mVar4.passed == 0) {
        unaff_R15 = (mp_int *)0x0;
      }
    }
    else {
      unaff_R15 = monty_export(mr->mc,pmVar3);
      mp_free(pmVar3);
      bVar1 = false;
    }
  } while (bVar1);
  return unaff_R15;
}

Assistant:

mp_int *miller_rabin_find_potential_primitive_root(MillerRabin *mr)
{
    while (true) {
        mp_int *mw = mp_unsafe_shrink(mp_random_in_range(mr->two, mr->pm1));
        struct mr_result result = miller_rabin_test_inner(mr, mw);

        if (result.passed && result.potential_primitive_root) {
            mp_int *pr = monty_export(mr->mc, mw);
            mp_free(mw);
            return pr;
        }

        mp_free(mw);

        if (!result.passed) {
            return NULL;
        }
    }
}